

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  byte bVar1;
  byte bVar2;
  float fVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  float arg1f;
  float arg0f;
  int arg1i;
  int data_backup [2];
  undefined8 local_68;
  double local_60;
  double *local_58;
  float local_4c;
  char *local_48;
  size_t local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar1 = *buf;
    uVar6 = (ulong)bVar1;
    if (0x2f < uVar6) break;
    if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_001413a6;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar5 = 0;
  bVar2 = bVar1;
LAB_001413bf:
  if (bVar2 == 0) {
LAB_001415ef:
    bVar7 = false;
  }
  else {
    local_40 = GDataTypeInfo[data_type].Size;
    local_58 = (double *)data_ptr;
    local_48 = initial_value_buf;
    memcpy(local_38,data_ptr,local_40);
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].ScanFmt;
    }
    local_4c = 0.0;
    if (data_type == 0) {
      local_60 = (double)CONCAT44(local_60._4_4_,*(float *)local_58);
      local_68 = (double)((ulong)local_68._4_4_ << 0x20);
      if (bVar5 == 0) {
LAB_00141549:
        iVar4 = __isoc99_sscanf(buf,format,&local_4c);
        fVar3 = local_4c;
        if (iVar4 == 1) {
LAB_0014166a:
          *(float *)local_58 = fVar3;
        }
      }
      else {
        iVar4 = __isoc99_sscanf(local_48,format,&local_60);
        if (iVar4 < 1) goto LAB_001415ef;
        if (bVar5 == 0x2a) {
          iVar4 = __isoc99_sscanf(buf,"%f",&local_68);
          if (iVar4 != 0) {
            fVar3 = (float)(int)((float)(int)local_60._0_4_ * (float)local_68);
            goto LAB_0014166a;
          }
        }
        else if (bVar5 == 0x2f) {
          iVar4 = __isoc99_sscanf(buf,"%f",&local_68);
          if (iVar4 != 0) {
            if (((float)local_68 != 0.0) || (NAN((float)local_68))) {
              fVar3 = (float)(int)((float)(int)local_60._0_4_ / (float)local_68);
              goto LAB_0014166a;
            }
          }
        }
        else {
          if (bVar5 != 0x2b) goto LAB_00141549;
          iVar4 = __isoc99_sscanf(buf,"%d",&local_4c);
          if (iVar4 != 0) {
            fVar3 = (float)((int)local_4c + (int)local_60._0_4_);
            goto LAB_0014166a;
          }
        }
      }
    }
    else if ((uint)data_type < 4) {
      __isoc99_sscanf(buf,format);
    }
    else if (data_type == 5) {
      local_60 = *local_58;
      local_68 = 0.0;
      if (((bVar5 != 0) && (iVar4 = __isoc99_sscanf(local_48,"%lf",&local_60), iVar4 < 1)) ||
         (iVar4 = __isoc99_sscanf(buf,"%lf",&local_68), iVar4 < 1)) goto LAB_001415ef;
      if (bVar5 == 0x2a) {
        dVar8 = local_60 * local_68;
      }
      else if (bVar5 == 0x2f) {
        if ((local_68 == 0.0) && (!NAN(local_68))) goto LAB_001416e8;
        dVar8 = local_60 / local_68;
      }
      else {
        dVar8 = local_68;
        if (bVar5 == 0x2b) {
          dVar8 = local_60 + local_68;
        }
      }
      *local_58 = dVar8;
    }
    else if (data_type == 4) {
      local_60 = (double)CONCAT44(local_60._4_4_,*(float *)local_58);
      local_68 = (double)((ulong)local_68._4_4_ << 0x20);
      if (((bVar5 != 0) && (iVar4 = __isoc99_sscanf(local_48,"%f",&local_60), iVar4 < 1)) ||
         (iVar4 = __isoc99_sscanf(buf,"%f",&local_68), iVar4 < 1)) goto LAB_001415ef;
      if (bVar5 == 0x2a) {
        fVar3 = local_60._0_4_ * (float)local_68;
      }
      else if (bVar5 == 0x2f) {
        if (((float)local_68 == 0.0) && (!NAN((float)local_68))) goto LAB_001416e8;
        fVar3 = local_60._0_4_ / (float)local_68;
      }
      else {
        fVar3 = (float)local_68;
        if (bVar5 == 0x2b) {
          fVar3 = local_60._0_4_ + (float)local_68;
        }
      }
      *(float *)local_58 = fVar3;
    }
LAB_001416e8:
    iVar4 = bcmp(local_38,local_58,local_40);
    bVar7 = iVar4 != 0;
  }
  return bVar7;
LAB_001413a6:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
      bVar2 = *buf;
    } while (bVar2 == 0x20);
    bVar5 = bVar1;
  } while (bVar2 == 9);
  goto LAB_001413bf;
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeInfo[data_type].Size <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeInfo[data_type].Size);

    if (format == NULL)
        format = GDataTypeInfo[data_type].ScanFmt;

    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)data_ptr;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // Assign constant
        // FIXME: We don't bother handling support for legacy operators since they are a little too crappy. Instead we may implement a proper expression evaluator in the future.
        sscanf(buf, format, data_ptr);
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeInfo[data_type].Size) != 0;
}